

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_single.h
# Opt level: O1

void __thiscall
density::detail::
LFQueue_Head<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
::Consume::clean_dead_elements(Consume *this)

{
  uintptr_t uVar1;
  uint uVar2;
  ControlBlock *pCVar3;
  
  uVar2 = (uint)this->m_next_ptr;
  while ((uVar2 & 3) == 2) {
    advance_head(this);
    pCVar3 = (ControlBlock *)(this->m_next_ptr & 0xfffffffffffffff0);
    this->m_control = pCVar3;
    uVar1 = pCVar3->m_next;
    this->m_next_ptr = uVar1;
    uVar2 = (uint)uVar1;
  }
  return;
}

Assistant:

void clean_dead_elements() noexcept
                {
                    while ((m_next_ptr & (LfQueue_Busy | LfQueue_Dead)) == LfQueue_Dead)
                    {
                        advance_head();
                        move_next();
                    }
                }